

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

bool __thiscall cppjieba::SegmentBase::ResetSeparators(SegmentBase *this,string *s)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  byte bVar4;
  string *in_RSI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar5;
  size_t i;
  RuneStrArray runes;
  RuneStrArray *in_stack_fffffffffffffab8;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffac0;
  value_type *in_stack_fffffffffffffac8;
  LocalVector<cppjieba::RuneStr> *in_stack_fffffffffffffad0;
  LocalVector<cppjieba::RuneStr> *this_00;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  string local_4d0 [28];
  int in_stack_fffffffffffffb4c;
  char *in_stack_fffffffffffffb50;
  size_t in_stack_fffffffffffffb58;
  Logger *in_stack_fffffffffffffb60;
  ulong local_310;
  Logger local_300;
  LocalVector<cppjieba::RuneStr> local_170;
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)0x160bdd);
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(in_stack_fffffffffffffad0);
  bVar1 = DecodeRunesInString((string *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  if (bVar1) {
    local_310 = 0;
    while( true ) {
      sVar3 = limonp::LocalVector<cppjieba::RuneStr>::size(&local_170);
      if (sVar3 <= local_310) break;
      limonp::LocalVector<cppjieba::RuneStr>::operator[](&local_170,local_310);
      pVar5 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      bVar4 = pVar5.second;
      if (((bVar4 ^ 0xff) & 1) != 0) {
        limonp::Logger::Logger
                  (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                   in_stack_fffffffffffffb4c);
        poVar2 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffffb50);
        this_00 = &local_170;
        limonp::LocalVector<cppjieba::RuneStr>::operator[](this_00,local_310);
        limonp::LocalVector<cppjieba::RuneStr>::operator[](this_00,local_310);
        std::__cxx11::string::substr((ulong)local_4d0,(ulong)local_18);
        in_stack_fffffffffffffac0 =
             (LocalVector<cppjieba::RuneStr> *)std::operator<<(poVar2,local_4d0);
        std::operator<<((ostream *)in_stack_fffffffffffffac0," already exists");
        std::__cxx11::string::~string(local_4d0);
        limonp::Logger::~Logger((Logger *)CONCAT17(bVar4,in_stack_fffffffffffffaf0));
        local_1 = 0;
        goto LAB_00160ef6;
      }
      local_310 = local_310 + 1;
    }
    local_1 = 1;
  }
  else {
    limonp::Logger::Logger
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
               in_stack_fffffffffffffb4c);
    poVar2 = limonp::Logger::Stream(&local_300);
    poVar2 = std::operator<<(poVar2,"decode ");
    poVar2 = std::operator<<(poVar2,local_18);
    std::operator<<(poVar2," failed");
    limonp::Logger::~Logger((Logger *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0))
    ;
    local_1 = 0;
  }
LAB_00160ef6:
  limonp::LocalVector<cppjieba::RuneStr>::~LocalVector(in_stack_fffffffffffffac0);
  return (bool)(local_1 & 1);
}

Assistant:

bool ResetSeparators(const string& s) {
    symbols_.clear();
    RuneStrArray runes;
    if (!DecodeRunesInString(s, runes)) {
      XLOG(ERROR) << "decode " << s << " failed";
      return false;
    }
    for (size_t i = 0; i < runes.size(); i++) {
      if (!symbols_.insert(runes[i].rune).second) {
        XLOG(ERROR) << s.substr(runes[i].offset, runes[i].len) << " already exists";
        return false;
      }
    }
    return true;
  }